

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalRefining.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_208::GlobalRefining::run::GetUpdater::~GetUpdater(GetUpdater *this)

{
  WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>::~WalkerPass
            (&this->
              super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>);
  operator_delete(this,0x120);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }